

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash.c
# Opt level: O1

void oah_print(ion_hashmap_t *hash_map,int size,ion_record_info_t *record)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  
  puts("Printing map");
  if (0 < size) {
    uVar3 = 0;
    do {
      printf("%d -- %i ",(ulong)uVar3,
             (ulong)(uint)(int)hash_map->entry
                               [(int)((record->key_size + record->value_size + 1) * uVar3)]);
      if (hash_map->entry[(int)((record->key_size + record->value_size + 1) * uVar3)] == -1) {
        printf("(null)");
      }
      else {
        uVar1 = record->value_size + record->key_size;
        uVar2 = (ulong)uVar1;
        if (uVar1 != 0 && SCARRY4(record->value_size,record->key_size) == (int)uVar1 < 0) {
          lVar4 = 0;
          do {
            printf("%X ",(ulong)(byte)hash_map->entry
                                      [lVar4 + 1 + (long)(int)(((int)uVar2 + 1) * uVar3)]);
            lVar4 = lVar4 + 1;
            uVar2 = (long)record->value_size + (long)record->key_size;
          } while (lVar4 < (long)uVar2);
        }
      }
      putchar(10);
      uVar3 = uVar3 + 1;
    } while (uVar3 != size);
  }
  return;
}

Assistant:

void
oah_print(
	ion_hashmap_t		*hash_map,
	int					size,
	ion_record_info_t	*record
) {
	int i;

	printf("Printing map\n");

	for (i = 0; i < size; i++) {
		printf("%d -- %i ", i, ((ion_hash_bucket_t *) ((hash_map->entry + (record->key_size + record->value_size + SIZEOF(STATUS)) * i)))->status);
		{
			if (((ion_hash_bucket_t *) ((hash_map->entry + (record->key_size + record->value_size + SIZEOF(STATUS)) * i)))->status == (ION_EMPTY | ION_DELETED)) {
				printf("(null)");
			}
			else {
				int j;

				for (j = 0; j < (record->key_size + record->value_size); j++) {
					printf("%X ", *(ion_byte_t *) (((ion_hash_bucket_t *) ((hash_map->entry + (record->key_size + record->value_size + SIZEOF(STATUS)) * i)))->data + j));
				}
			}

			printf("\n");
		}
	}
}